

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O0

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrColor4f *value,string *prefix,
               string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  *pvVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_770 [36];
  int local_74c;
  ostringstream local_748 [8];
  ostringstream oss_a;
  string local_5d0 [8];
  string a_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0 [36];
  int local_58c;
  ostringstream local_588 [8];
  ostringstream oss_b;
  string local_410 [8];
  string b_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0 [36];
  int local_3cc;
  ostringstream local_3c8 [8];
  ostringstream oss_g;
  string local_250 [8];
  string g_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230 [36];
  int local_20c;
  ostringstream local_208 [8];
  ostringstream oss_r;
  string local_90 [8];
  string r_prefix;
  XrColor4f local_60 [2];
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  *local_40;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *contents_local;
  string *psStack_30;
  bool is_pointer_local;
  string *type_string_local;
  string *prefix_local;
  XrColor4f *value_local;
  XrGeneratedDispatchTable *gen_dispatch_table_local;
  
  local_40 = (vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents;
  contents_local._7_1_ = is_pointer;
  psStack_30 = type_string;
  type_string_local = prefix;
  prefix_local = (string *)value;
  value_local = (XrColor4f *)gen_dispatch_table;
  PointerToHexString<XrColor4f>(local_60);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  std::__cxx11::string::~string((string *)local_60);
  if ((contents_local._7_1_ & 1) == 0) {
    std::__cxx11::string::operator+=((string *)prefix,".");
  }
  else {
    std::__cxx11::string::operator+=((string *)prefix,"->");
  }
  std::__cxx11::string::string(local_90,(string *)prefix);
  std::__cxx11::string::operator+=(local_90,"r");
  std::__cxx11::ostringstream::ostringstream(local_208);
  local_20c = (int)std::setprecision(0x20);
  poVar2 = std::operator<<((ostream *)local_208,(_Setprecision)local_20c);
  std::ostream::operator<<(poVar2,*(float *)prefix_local);
  pvVar1 = local_40;
  std::__cxx11::ostringstream::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
            (pvVar1,(char (*) [6])"float",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,local_230
            );
  std::__cxx11::string::~string((string *)local_230);
  std::__cxx11::string::string(local_250,(string *)prefix);
  std::__cxx11::string::operator+=(local_250,"g");
  std::__cxx11::ostringstream::ostringstream(local_3c8);
  local_3cc = (int)std::setprecision(0x20);
  poVar2 = std::operator<<((ostream *)local_3c8,(_Setprecision)local_3cc);
  std::ostream::operator<<(poVar2,*(float *)(prefix_local + 4));
  pvVar1 = local_40;
  std::__cxx11::ostringstream::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
            (pvVar1,(char (*) [6])"float",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250,
             local_3f0);
  std::__cxx11::string::~string((string *)local_3f0);
  std::__cxx11::string::string(local_410,(string *)prefix);
  std::__cxx11::string::operator+=(local_410,"b");
  std::__cxx11::ostringstream::ostringstream(local_588);
  local_58c = (int)std::setprecision(0x20);
  poVar2 = std::operator<<((ostream *)local_588,(_Setprecision)local_58c);
  std::ostream::operator<<(poVar2,*(float *)(prefix_local + 8));
  pvVar1 = local_40;
  std::__cxx11::ostringstream::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
            (pvVar1,(char (*) [6])"float",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410,
             local_5b0);
  std::__cxx11::string::~string((string *)local_5b0);
  std::__cxx11::string::string(local_5d0,(string *)prefix);
  std::__cxx11::string::operator+=(local_5d0,"a");
  std::__cxx11::ostringstream::ostringstream(local_748);
  local_74c = (int)std::setprecision(0x20);
  poVar2 = std::operator<<((ostream *)local_748,(_Setprecision)local_74c);
  std::ostream::operator<<(poVar2,*(float *)(prefix_local + 0xc));
  pvVar1 = local_40;
  std::__cxx11::ostringstream::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
            (pvVar1,(char (*) [6])"float",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5d0,
             local_770);
  std::__cxx11::string::~string((string *)local_770);
  gen_dispatch_table_local._7_1_ = 1;
  std::__cxx11::ostringstream::~ostringstream(local_748);
  std::__cxx11::string::~string(local_5d0);
  std::__cxx11::ostringstream::~ostringstream(local_588);
  std::__cxx11::string::~string(local_410);
  std::__cxx11::ostringstream::~ostringstream(local_3c8);
  std::__cxx11::string::~string(local_250);
  std::__cxx11::ostringstream::~ostringstream(local_208);
  std::__cxx11::string::~string(local_90);
  return (bool)(gen_dispatch_table_local._7_1_ & 1);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrColor4f* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string r_prefix = prefix;
        r_prefix += "r";
        std::ostringstream oss_r;
        oss_r << std::setprecision(32) << (value->r);
        contents.emplace_back("float", r_prefix, oss_r.str());
        std::string g_prefix = prefix;
        g_prefix += "g";
        std::ostringstream oss_g;
        oss_g << std::setprecision(32) << (value->g);
        contents.emplace_back("float", g_prefix, oss_g.str());
        std::string b_prefix = prefix;
        b_prefix += "b";
        std::ostringstream oss_b;
        oss_b << std::setprecision(32) << (value->b);
        contents.emplace_back("float", b_prefix, oss_b.str());
        std::string a_prefix = prefix;
        a_prefix += "a";
        std::ostringstream oss_a;
        oss_a << std::setprecision(32) << (value->a);
        contents.emplace_back("float", a_prefix, oss_a.str());
        return true;
    } catch(...) {
    }
    return false;
}